

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O2

ssize_t libssh2_sftp_read(LIBSSH2_SFTP_HANDLE *hnd,char *buffer,size_t buffer_maxlen)

{
  size_t *psVar1;
  void **ppvVar2;
  libssh2_nonblocking_states lVar3;
  LIBSSH2_CHANNEL *pLVar4;
  LIBSSH2_SESSION *pLVar5;
  uint value;
  uchar *puVar6;
  ulong uVar7;
  uint32_t uVar8;
  int iVar9;
  ulong uVar10;
  unsigned_long uVar11;
  list_node *plVar12;
  uchar *puVar13;
  long lVar14;
  char *pcVar15;
  list_node *plVar16;
  list_node *plVar17;
  LIBSSH2_SFTP *pLVar18;
  LIBSSH2_SFTP_HANDLE *handle;
  list_node *plVar19;
  list_head *head;
  bool bVar20;
  ssize_t sStackY_a0;
  list_head *plVar21;
  uchar *s;
  LIBSSH2_SFTP_HANDLE *local_80;
  list_node *local_78;
  LIBSSH2_SFTP *local_70;
  uchar *local_68;
  uint32_t local_5c;
  char *local_58;
  LIBSSH2_CHANNEL *local_50;
  ulong local_48;
  time_t local_40;
  char *local_38;
  
  if (hnd == (LIBSSH2_SFTP_HANDLE *)0x0) {
    sStackY_a0 = -0x27;
  }
  else {
    local_78 = (list_node *)buffer_maxlen;
    local_58 = buffer;
    local_40 = time((time_t *)0x0);
    local_48 = 0x800000;
    if ((ulong)((long)local_78 * 4) < 0x800000) {
      local_48 = (long)local_78 * 4;
    }
    local_5c = (int)local_48 * 8;
    local_38 = hnd->handle;
    head = &hnd->packet_list;
    plVar21 = head;
    local_80 = hnd;
    do {
      uVar7 = local_48;
      handle = local_80;
      pLVar18 = hnd->sftp;
      pLVar4 = pLVar18->channel;
      pLVar5 = pLVar4->session;
      lVar3 = pLVar18->read_state;
      local_70 = pLVar18;
      if (lVar3 == libssh2_NB_state_sent2) {
LAB_00121bfc:
        pLVar18->read_state = libssh2_NB_state_idle;
        plVar19 = (list_node *)_libssh2_list_first(head);
        plVar17 = (list_node *)0x0;
        pcVar15 = local_58;
        head = plVar21;
        while ((handle = local_80, plVar19 != (list_node *)0x0 &&
               (local_68 = (uchar *)0x0, plVar19[2].next == (list_node *)0x0))) {
          iVar9 = sftp_packet_requirev
                            (local_70,0x12f8aa,(uchar *)(ulong)*(uint *)&plVar19[2].prev,
                             (uint32_t)&s,&local_68,(size_t *)0x9,(size_t)head);
          plVar21 = head;
          if ((iVar9 == -0x25) && (plVar17 != (list_node *)0x0)) goto LAB_00121ebf;
          if (iVar9 == -0x26) {
            if (local_68 != (uchar *)0x0) {
              (*pLVar5->free)(s,&pLVar5->abstract);
            }
            pcVar15 = "Response too small";
            goto LAB_00121e28;
          }
          if (iVar9 < 0) {
            plVar17 = (list_node *)(long)iVar9;
            local_70->read_state = libssh2_NB_state_sent2;
            goto LAB_00121ebf;
          }
          if (*s != 'g') {
            if (*s != 'e') {
              iVar9 = -0x1f;
              pcVar15 = "SFTP Protocol badness: unrecognised read request response";
              goto LAB_00121eb3;
            }
            _libssh2_list_remove(plVar19);
            (*pLVar5->free)(plVar19,&pLVar5->abstract);
            sftp_packetlist_flush(handle);
            uVar8 = _libssh2_ntohu32(s + 5);
            (*pLVar5->free)(s,&pLVar5->abstract);
            if (uVar8 == 1) {
              (handle->u).file.eof = '\x01';
              plVar21 = head;
            }
            else {
              local_70->last_errno = uVar8;
              iVar9 = -0x1f;
              pcVar15 = "SFTP READ error";
LAB_00121eb3:
              iVar9 = _libssh2_error(pLVar5,iVar9,pcVar15);
              plVar17 = (list_node *)(long)iVar9;
              plVar21 = head;
            }
            goto LAB_00121ebf;
          }
          if (plVar19[1].next != (list_node *)(handle->u).file.offset) {
            iVar9 = -0x1f;
            pcVar15 = "Read Packet At Unexpected Offset";
            goto LAB_00121eb3;
          }
          uVar8 = _libssh2_ntohu32(s + 5);
          puVar6 = s;
          plVar12 = (list_node *)(ulong)uVar8;
          if ((list_node *)(local_68 + -9) < plVar12) {
            iVar9 = -0x1f;
            pcVar15 = "SFTP Protocol badness";
            goto LAB_00121eb3;
          }
          lVar14 = (long)plVar12 - (long)plVar19[1].prev;
          if (plVar19[1].prev <= plVar12 && lVar14 != 0) {
            iVar9 = -0x1f;
            pcVar15 = "FXP_READ response too big";
            goto LAB_00121eb3;
          }
          if (lVar14 != 0) {
            ppvVar2 = &(handle->u).dir.names_packet;
            *ppvVar2 = (void *)((long)*ppvVar2 + lVar14);
          }
          plVar16 = (list_node *)((long)&plVar12->next + (long)&plVar17->next);
          if (plVar16 < local_78 || (long)plVar16 - (long)local_78 == 0) {
            puVar13 = (uchar *)0x0;
          }
          else {
            (handle->u).file.data_left = (long)plVar16 - (long)local_78;
            plVar12 = (list_node *)(ulong)(uint)((int)local_78 - (int)plVar17);
            (handle->u).file.data = s;
            plVar16 = (list_node *)((long)&plVar12->next + (long)&plVar17->next);
            puVar13 = local_68;
          }
          (handle->u).file.data_len = (size_t)puVar13;
          memcpy(pcVar15,s + 9,(size_t)plVar12);
          (handle->u).file.offset = (long)&plVar12->next + (handle->u).file.offset;
          if ((handle->u).file.data_len == 0) {
            (*pLVar5->free)(puVar6,&pLVar5->abstract);
          }
          pcVar15 = pcVar15 + (long)plVar12;
          plVar12 = (list_node *)_libssh2_list_next(plVar19);
          _libssh2_list_remove(plVar19);
          (*pLVar5->free)(plVar19,&pLVar5->abstract);
          plVar17 = plVar16;
          plVar19 = plVar12;
          if (local_78 <= plVar16) {
            plVar19 = (list_node *)0x0;
          }
        }
        plVar21 = head;
        if (plVar17 == (list_node *)0x0) {
          pcVar15 = "sftp_read() internal error";
LAB_00121e28:
          iVar9 = _libssh2_error(pLVar5,-0x1f,pcVar15);
          plVar17 = (list_node *)(long)iVar9;
        }
LAB_00121ebf:
        hnd = handle;
        if (plVar17 != (list_node *)0xffffffffffffffdb) {
          return (ssize_t)plVar17;
        }
      }
      else {
        local_50 = pLVar4;
        if (lVar3 == libssh2_NB_state_sent) {
LAB_00121b8b:
          pLVar18->read_state = libssh2_NB_state_idle;
          plVar19 = (list_node *)_libssh2_list_first(head);
          pLVar4 = local_50;
          for (; plVar19 != (list_node *)0x0; plVar19 = (list_node *)_libssh2_list_next(plVar19)) {
            while (plVar19[2].next != (list_node *)0x0) {
              plVar17 = (list_node *)
                        _libssh2_channel_write
                                  (pLVar4,0,(undefined1 *)((long)&plVar19[2].prev + 4) +
                                            (long)&(plVar19[1].head)->last,(size_t)plVar19[2].next);
              if ((long)plVar17 < 0) {
                pLVar18->read_state = libssh2_NB_state_sent;
                handle = local_80;
                goto LAB_00121ebf;
              }
              plVar19[1].head = (list_head *)((long)&plVar17->next + (long)&(plVar19[1].head)->last)
              ;
              plVar12 = plVar19 + 2;
              plVar12->next = (list_node *)((long)plVar12->next - (long)plVar17);
              if (plVar12->next == (list_node *)0x0) break;
              plVar17 = (list_node *)_libssh2_list_first(head);
              if (plVar19 != plVar17) goto LAB_00121bfc;
            }
          }
          goto LAB_00121bfc;
        }
        if (lVar3 != libssh2_NB_state_idle) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                        ,0x6f4,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        pLVar18->last_errno = 0;
        plVar19 = (list_node *)(local_80->u).file.data_left;
        if (plVar19 != (list_node *)0x0) {
          plVar17 = local_78;
          if (plVar19 < local_78) {
            plVar17 = plVar19;
          }
          memcpy(local_58,(local_80->u).file.data + ((local_80->u).file.data_len - (long)plVar19),
                 (size_t)plVar17);
          (handle->u).file.offset = (long)&plVar17->next + (handle->u).file.offset;
          psVar1 = &(handle->u).file.data_left;
          *psVar1 = *psVar1 - (long)plVar17;
          if (*psVar1 == 0) {
            (*pLVar5->free)((handle->u).file.data,&pLVar5->abstract);
            (handle->u).file.data = (uchar *)0x0;
          }
          goto LAB_00121ebf;
        }
        if ((local_80->u).file.eof != '\0') {
          return 0;
        }
        uVar10 = (long)(local_80->u).dir.names_packet - (local_80->u).file.offset;
        plVar19 = (list_node *)(local_48 - uVar10);
        if (local_48 < uVar10) {
          plVar19 = (list_node *)0x0;
        }
        uVar11 = libssh2_channel_window_read_ex(pLVar4,(unsigned_long *)0x0,(unsigned_long *)0x0);
        if ((uVar7 <= uVar11) ||
           (iVar9 = _libssh2_channel_receive_window_adjust
                              (pLVar18->channel,local_5c,'\x01',(uint *)0x0), iVar9 == 0)) {
          while (plVar17 = local_78, handle = local_80, plVar19 != (list_node *)0x0) {
            iVar9 = (int)local_80->handle_len;
            plVar16 = (list_node *)(ulong)(iVar9 + 0x19);
            plVar12 = (list_node *)(*pLVar5->alloc)((size_t)&plVar16[2].head,&pLVar5->abstract);
            if (plVar12 == (list_node *)0x0) {
              iVar9 = -6;
              pcVar15 = "malloc fail for FXP_WRITE";
              head = plVar21;
              goto LAB_00121eb3;
            }
            if (plVar17 <= (list_node *)((ulong)plVar19 & 0xffffffff)) {
              plVar17 = plVar19;
            }
            value = (uint)plVar17;
            if (29999 < (uint)plVar17) {
              value = 30000;
            }
            plVar17 = (list_node *)(ulong)value;
            plVar12[1].next = (list_node *)(handle->u).file.offset_sent;
            plVar12[1].prev = plVar17;
            plVar12[2].next = plVar16;
            plVar12[1].head = (list_head *)0x0;
            s = (uchar *)((long)&plVar12[2].prev + 4);
            _libssh2_store_u32(&s,iVar9 + 0x15);
            pLVar18 = local_70;
            *s = '\x05';
            uVar8 = local_70->request_id;
            local_70->request_id = uVar8 + 1;
            *(uint32_t *)&plVar12[2].prev = uVar8;
            s = s + 1;
            _libssh2_store_u32(&s,uVar8);
            _libssh2_store_str(&s,local_38,handle->handle_len);
            _libssh2_store_u64(&s,(handle->u).file.offset_sent);
            ppvVar2 = &(handle->u).dir.names_packet;
            *ppvVar2 = (void *)((long)&plVar17->next + (long)*ppvVar2);
            head = plVar21;
            _libssh2_store_u32(&s,value);
            plVar21 = head;
            _libssh2_list_add(head,plVar12);
            bVar20 = plVar19 < plVar17;
            plVar19 = (list_node *)((long)plVar19 - (long)plVar17);
            if (bVar20) {
              plVar19 = (list_node *)0x0;
            }
          }
          goto LAB_00121b8b;
        }
        if (iVar9 != -0x25) {
          plVar17 = (list_node *)(long)iVar9;
          handle = local_80;
          goto LAB_00121ebf;
        }
        if ((local_80->u).file.data_left != 0) {
          __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                        ,0x5ee,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
        hnd = local_80;
        if ((local_80->u).file.eof != '\0') {
          __assert_fail("rc != LIBSSH2_ERROR_EAGAIN || !filep->eof",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sysprogs[P]libssh2/src/sftp.c"
                        ,0x5ef,"ssize_t sftp_read(LIBSSH2_SFTP_HANDLE *, char *, size_t)");
        }
      }
      pLVar5 = hnd->sftp->channel->session;
      if (pLVar5->api_block_mode == 0) {
        return -0x25;
      }
      iVar9 = _libssh2_wait_socket(pLVar5,local_40);
    } while (iVar9 == 0);
    sStackY_a0 = (ssize_t)iVar9;
  }
  return sStackY_a0;
}

Assistant:

static ssize_t sftp_read(LIBSSH2_SFTP_HANDLE * handle, char *buffer,
                         size_t buffer_size)
{
    LIBSSH2_SFTP *sftp = handle->sftp;
    LIBSSH2_CHANNEL *channel = sftp->channel;
    LIBSSH2_SESSION *session = channel->session;
    size_t count = 0;
    struct sftp_pipeline_chunk *chunk;
    struct sftp_pipeline_chunk *next;
    ssize_t rc;
    struct _libssh2_sftp_handle_file_data *filep =
        &handle->u.file;
    size_t bytes_in_buffer = 0;
    char *sliding_bufferp = buffer;

    /* This function can be interrupted in three different places where it
       might need to wait for data from the network.  It returns EAGAIN to
       allow non-blocking clients to do other work but these client are
       expected to call this function again (possibly many times) to finish
       the operation.

       The tricky part is that if we previously aborted a sftp_read due to
       EAGAIN, we must continue at the same spot to continue the previously
       interrupted operation.  This is done using a state machine to record
       what phase of execution we were at.  The state is stored in
       sftp->read_state.

       libssh2_NB_state_idle: The first phase is where we prepare multiple
       FXP_READ packets to do optimistic read-ahead.  We send off as many as
       possible in the second phase without waiting for a response to each
       one; this is the key to fast reads. But we may have to adjust the
       channel window size to do this which may interrupt this function while
       waiting.  The state machine saves the phase as libssh2_NB_state_idle so
       it returns here on the next call.

       libssh2_NB_state_sent: The second phase is where we send the FXP_READ
       packets.  Writing them to the channel can be interrupted with EAGAIN
       but the state machine ensures we skip the first phase on the next call
       and resume sending.

       libssh2_NB_state_sent2: In the third phase (indicated by ) we read the
       data from the responses that have arrived so far.  Reading can be
       interrupted with EAGAIN but the state machine ensures we skip the first
       and second phases on the next call and resume sending.
    */

    switch(sftp->read_state) {
    case libssh2_NB_state_idle:
        sftp->last_errno = LIBSSH2_FX_OK;

        /* Some data may already have been read from the server in the
           previous call but didn't fit in the buffer at the time.  If so, we
           return that now as we can't risk being interrupted later with data
           partially written to the buffer. */
        if(filep->data_left) {
            size_t copy = LIBSSH2_MIN(buffer_size, filep->data_left);

            memcpy(buffer, &filep->data[ filep->data_len - filep->data_left],
                   copy);

            filep->data_left -= copy;
            filep->offset += copy;

            if(!filep->data_left) {
                LIBSSH2_FREE(session, filep->data);
                filep->data = NULL;
            }

            return copy;
        }

        if(filep->eof) {
            return 0;
        }
        else {
            /* We allow a number of bytes being requested at any given time
               without having been acked - until we reach EOF. */

            /* Number of bytes asked for that haven't been acked yet */
            size_t already = (size_t)(filep->offset_sent - filep->offset);

            size_t max_read_ahead = buffer_size*4;
            unsigned long recv_window;

            if(max_read_ahead > LIBSSH2_CHANNEL_WINDOW_DEFAULT*4)
                max_read_ahead = LIBSSH2_CHANNEL_WINDOW_DEFAULT*4;

            /* if the buffer_size passed in now is smaller than what has
               already been sent, we risk getting count become a very large
               number */
            if(max_read_ahead > already)
                count = max_read_ahead - already;

            /* 'count' is how much more data to ask for, and 'already' is how
               much data that already has been asked for but not yet returned.
               Specifically, 'count' means how much data that have or will be
               asked for by the nodes that are already added to the linked
               list. Some of those read requests may not actually have been
               sent off successfully yet.

               If 'already' is very large it should be perfectly fine to have
               count set to 0 as then we don't have to ask for more data
               (right now).

               buffer_size*4 is just picked more or less out of the air. The
               idea is that when reading SFTP from a remote server, we send
               away multiple read requests guessing that the client will read
               more than only this 'buffer_size' amount of memory. So we ask
               for maximum buffer_size*4 amount of data so that we can return
               them very fast in subsequent calls.
            */

            recv_window = libssh2_channel_window_read_ex(sftp->channel,
                                                         NULL, NULL);
            if(max_read_ahead > recv_window) {
                /* more data will be asked for than what the window currently
                   allows, expand it! */

                rc = _libssh2_channel_receive_window_adjust(sftp->channel,
                                               (uint32_t)(max_read_ahead * 8),
                                               1, NULL);
                /* if this returns EAGAIN, we will get back to this function
                   at next call */
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->data_left);
                assert(rc != LIBSSH2_ERROR_EAGAIN || !filep->eof);
                if(rc)
                    return rc;
            }
        }

        while(count > 0) {
            unsigned char *s;

            /* 25 = packet_len(4) + packet_type(1) + request_id(4) +
               handle_len(4) + offset(8) + count(4) */
            uint32_t packet_len = (uint32_t)(handle->handle_len + 25);
            uint32_t request_id;

            uint32_t size = (uint32_t)count;
            if(size < buffer_size)
                size = (uint32_t)buffer_size;
            if(size > MAX_SFTP_READ_SIZE)
                size = MAX_SFTP_READ_SIZE;

            chunk = LIBSSH2_ALLOC(session, packet_len +
                                  sizeof(struct sftp_pipeline_chunk));
            if(!chunk)
                return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                      "malloc fail for FXP_WRITE");

            chunk->offset = filep->offset_sent;
            chunk->len = size;
            chunk->lefttosend = packet_len;
            chunk->sent = 0;

            s = chunk->packet;

            _libssh2_store_u32(&s, packet_len - 4);
            *s++ = SSH_FXP_READ;
            request_id = sftp->request_id++;
            chunk->request_id = request_id;
            _libssh2_store_u32(&s, request_id);
            _libssh2_store_str(&s, handle->handle, handle->handle_len);
            _libssh2_store_u64(&s, filep->offset_sent);
            filep->offset_sent += size; /* advance offset at once */
            _libssh2_store_u32(&s, size);

            /* add this new entry LAST in the list */
            _libssh2_list_add(&handle->packet_list, &chunk->node);
            /* deduct the size we used, as we might have to create
               more packets */
            count -= LIBSSH2_MIN(size, count);
            _libssh2_debug((session, LIBSSH2_TRACE_SFTP,
                           "read request id %d sent (offset: %d, size: %d)",
                           request_id, (int)chunk->offset, (int)chunk->len));
        }
        /* FALL-THROUGH */
    case libssh2_NB_state_sent:

        sftp->read_state = libssh2_NB_state_idle;

        /* move through the READ packets that haven't been sent and send as
           many as possible - remember that we don't block */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            if(chunk->lefttosend) {

                rc = _libssh2_channel_write(channel, 0,
                                            &chunk->packet[chunk->sent],
                                            chunk->lefttosend);
                if(rc < 0) {
                    sftp->read_state = libssh2_NB_state_sent;
                    return rc;
                }

                /* remember where to continue sending the next time */
                chunk->lefttosend -= rc;
                chunk->sent += rc;

                if(chunk->lefttosend) {
                    /* We still have data left to send for this chunk.
                     * If there is at least one completely sent chunk,
                     * we can get out of this loop and start reading.  */
                    if(chunk != _libssh2_list_first(&handle->packet_list)) {
                        break;
                    }
                    else {
                        continue;
                    }
                }
            }

            /* move on to the next chunk with data to send */
            chunk = _libssh2_list_next(&chunk->node);
        }
        /* FALL-THROUGH */

    case libssh2_NB_state_sent2:

        sftp->read_state = libssh2_NB_state_idle;

        /*
         * Count all ACKed packets and act on the contents of them.
         */
        chunk = _libssh2_list_first(&handle->packet_list);

        while(chunk) {
            unsigned char *data;
            size_t data_len = 0;
            uint32_t rc32;
            static const unsigned char read_responses[2] = {
                SSH_FXP_DATA, SSH_FXP_STATUS
            };

            if(chunk->lefttosend) {
                /* if the chunk still has data left to send, we shouldn't wait
                   for an ACK for it just yet */
                if(bytes_in_buffer > 0) {
                    return bytes_in_buffer;
                }
                else {
                    /* we should never reach this point */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "sftp_read() internal error");
                }
            }

            rc = sftp_packet_requirev(sftp, 2, read_responses,
                                      chunk->request_id, &data, &data_len, 9);
            if(rc == LIBSSH2_ERROR_EAGAIN && bytes_in_buffer) {
                /* do not return EAGAIN if we have already
                 * written data into the buffer */
                return bytes_in_buffer;
            }

            if(rc == LIBSSH2_ERROR_BUFFER_TOO_SMALL) {
                if(data_len > 0) {
                    LIBSSH2_FREE(session, data);
                }
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "Response too small");
            }
            else if(rc < 0) {
                sftp->read_state = libssh2_NB_state_sent2;
                return rc;
            }

            /*
             * We get DATA or STATUS back. STATUS can be error, or it is
             * FX_EOF when we reach the end of the file.
             */

            switch(data[0]) {
            case SSH_FXP_STATUS:
                /* remove the chunk we just processed */

                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* we must remove all outstanding READ requests, as either we
                   got an error or we're at end of file */
                sftp_packetlist_flush(handle);

                rc32 = _libssh2_ntohu32(data + 5);
                LIBSSH2_FREE(session, data);

                if(rc32 == LIBSSH2_FX_EOF) {
                    filep->eof = TRUE;
                    return bytes_in_buffer;
                }
                else {
                    sftp->last_errno = rc32;
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP READ error");
                }
                break;

            case SSH_FXP_DATA:
                if(chunk->offset != filep->offset) {
                    /* This could happen if the server returns less bytes than
                       requested, which shouldn't happen for normal files. See:
                       https://tools.ietf.org/html/draft-ietf-secsh-filexfer-02
                       #section-6.4
                     */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "Read Packet At Unexpected Offset");
                }

                rc32 = _libssh2_ntohu32(data + 5);
                if(rc32 > (data_len - 9))
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "SFTP Protocol badness");

                if(rc32 > chunk->len) {
                    /* A chunk larger than we requested was returned to us.
                       This is a protocol violation and we don't know how to
                       deal with it. Bail out! */
                    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                          "FXP_READ response too big");
                }

                if(rc32 != chunk->len) {
                    /* a short read does not imply end of file, but we must
                       adjust the offset_sent since it was advanced with a
                       full chunk->len before */
                    filep->offset_sent -= (chunk->len - rc32);
                }

                if((bytes_in_buffer + rc32) > buffer_size) {
                    /* figure out the overlap amount */
                    filep->data_left = (bytes_in_buffer + rc32) - buffer_size;

                    /* getting the full packet would overflow the buffer, so
                       only get the correct amount and keep the remainder */
                    rc32 = (uint32_t)(buffer_size - bytes_in_buffer);

                    /* store data to keep for next call */
                    filep->data = data;
                    filep->data_len = data_len;
                }
                else
                    filep->data_len = 0;

                /* copy the received data from the received FXP_DATA packet to
                   the buffer at the correct index */
                memcpy(sliding_bufferp, data + 9, rc32);
                filep->offset += rc32;
                bytes_in_buffer += rc32;
                sliding_bufferp += rc32;

                if(filep->data_len == 0)
                    /* free the allocated data if not stored to keep */
                    LIBSSH2_FREE(session, data);

                /* remove the chunk we just processed keeping track of the
                 * next one in case we need it */
                next = _libssh2_list_next(&chunk->node);
                _libssh2_list_remove(&chunk->node);
                LIBSSH2_FREE(session, chunk);

                /* check if we have space left in the buffer
                 * and either continue to the next chunk or stop
                 */
                if(bytes_in_buffer < buffer_size) {
                    chunk = next;
                }
                else {
                    chunk = NULL;
                }

                break;
            default:
                return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                                      "SFTP Protocol badness: unrecognised "
                                      "read request response");
            }
        }

        if(bytes_in_buffer > 0)
            return bytes_in_buffer;

        break;

    default:
        assert(0);  /* State machine error; unrecognised read state */
    }

    /* we should never reach this point */
    return _libssh2_error(session, LIBSSH2_ERROR_SFTP_PROTOCOL,
                          "sftp_read() internal error");
}